

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int i_2;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  int i_1;
  long lVar10;
  int i;
  ulong uVar11;
  long lVar12;
  float fVar13;
  int pitch;
  void *m_pixels;
  SDL_Event event;
  CHIP8 emulator;
  uint pixels [2048];
  int local_38d4;
  ulong local_38d0;
  void *local_38c8;
  int local_38c0 [5];
  uint local_38ac;
  CHIP8 local_3884;
  string local_2038 [256];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No ROM specified!\nUsage:\t",0x19);
    pcVar6 = *argv;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107198);
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <ROM path>",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    return 1;
  }
  CHIP8::CHIP8(&local_3884);
  CHIP8::initialise(&local_3884);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2038,argv[1],(allocator<char> *)local_38c0);
  bVar1 = CHIP8::loadROM(&local_3884,local_2038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
    operator_delete(local_2038[0]._M_dataplus._M_p,local_2038[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    iVar2 = SDL_Init(0xf231);
    if (iVar2 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Couldn\'t initialise SDL!\n",0x19);
      pcVar6 = (char *)SDL_GetError();
      poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      lVar8 = SDL_CreateWindow("CHIP8-Emulator",0x1fff0000,0x1fff0000,0x400,0x300,0x20);
      if (lVar8 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Couldn\'t create Window!\n",0x18);
        pcVar6 = (char *)SDL_GetError();
        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      else {
        lVar8 = SDL_CreateRenderer(lVar8,0xffffffff,0);
        if (lVar8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Couldn\'t create Renderer!\n",0x1a);
          pcVar6 = (char *)SDL_GetError();
          poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        else {
          lVar9 = SDL_CreateTexture(lVar8,0x16362004,1,0x40,0x20);
          if (lVar9 != 0) {
            uVar3 = SDL_GetTicks();
            uVar4 = SDL_GetTicks();
            uVar11 = (ulong)uVar4;
            lVar12 = 0;
            local_38d0 = (ulong)uVar3;
            do {
              while( true ) {
                while( true ) {
                  while (iVar2 = SDL_PollEvent(), iVar2 == 0) {
                    CHIP8::emulateCycle(&local_3884);
                    if (local_3884.drawFlag == true) {
                      iVar2 = SDL_LockTexture(lVar9,0,&local_38c8,&local_38d4);
                      if (iVar2 < 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Couldn\'t lock texture!\n",0x17);
                        pcVar6 = (char *)SDL_GetError();
                        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
                        std::endl<char,std::char_traits<char>>(poVar7);
                      }
                      lVar10 = 0;
                      do {
                        *(uint *)((long)&local_2038[0]._M_dataplus._M_p + lVar10 * 4) =
                             -(uint)local_3884.graphics[lVar10] | 0xff000000;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 0x800);
                      memcpy(local_38c8,local_2038,(long)local_38d4 << 5);
                      SDL_UnlockTexture(lVar9);
                      SDL_RenderClear(lVar8);
                      SDL_RenderCopy(lVar8,lVar9,0);
                      SDL_RenderPresent(lVar8);
                      local_3884.drawFlag = false;
                      uVar3 = SDL_GetTicks();
                      if ((long)(uVar3 - uVar11) < 0x10) {
                        iVar2 = SDL_GetTicks();
                        SDL_Delay(((int)uVar11 - iVar2) + 0x10);
                      }
                      uVar3 = SDL_GetTicks();
                      uVar4 = SDL_GetTicks();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Avg. FPS: ",10);
                      fVar13 = (float)lVar12 / ((float)(long)(uVar4 - local_38d0) / 1000.0);
                      poVar7 = std::ostream::_M_insert<double>
                                         ((double)(float)(~-(uint)(2e+06 < fVar13) & (uint)fVar13));
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\r",1);
                      uVar11 = (ulong)uVar3;
                      lVar12 = lVar12 + 1;
                    }
                    if (local_3884.beepFlag == true) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Beep!!                    \r",0x1b);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                      local_3884.beepFlag = false;
                    }
                  }
                  if (local_38c0[0] != 0x300) break;
                  if (local_38ac == 0x1b) goto LAB_00102940;
                  lVar10 = 0;
                  do {
                    if (local_38ac == SDLKeys[lVar10]) {
                      local_3884.key[lVar10] = '\x01';
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 0x10);
                }
                if (local_38c0[0] != 0x301) break;
                lVar10 = 0;
                do {
                  if (local_38ac == SDLKeys[lVar10]) {
                    local_3884.key[lVar10] = '\0';
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x10);
              }
            } while (local_38c0[0] != 0x100);
LAB_00102940:
            exit(0);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Couldn\'t create texture!\n",0x19);
          pcVar6 = (char *)SDL_GetError();
          poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
      }
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv){

    if(argc < 2){
        std::cerr << "No ROM specified!\nUsage:\t" << argv[0] << " <ROM path>" << std::endl;
        return 1;
    }

    CHIP8 emulator;

    emulator.initialise();

    if (!emulator.loadROM(argv[1])){
        exit(1);
    }

    SDL_Window   *window   = NULL;
    SDL_Renderer *renderer = NULL;
    SDL_Texture  *texture  = NULL;

    if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
        std::cerr << "Couldn't initialise SDL!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    window = SDL_CreateWindow("CHIP8-Emulator",
                SDL_WINDOWPOS_UNDEFINED,
                SDL_WINDOWPOS_UNDEFINED,
                WINDOW_WIDTH, WINDOW_HEIGHT,
                SDL_WINDOW_RESIZABLE);

    if (window == NULL){
        std::cerr << "Couldn't create Window!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    renderer = SDL_CreateRenderer(window, -1, 0);

    if (renderer == NULL){
        std::cerr << "Couldn't create Renderer!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    texture = SDL_CreateTexture(renderer,
                    SDL_PIXELFORMAT_ARGB8888,
                    SDL_TEXTUREACCESS_STREAMING,
                    GRAPHICS_WIDTH, GRAPHICS_HEIGHT);

    if(texture == NULL){
        std::cerr << "Couldn't create texture!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    unsigned int pixels[GRAPHICS_HEIGHT * GRAPHICS_WIDTH];
    int  timer = 0;
    long start = SDL_GetTicks(); // For measuring average FPS
    long start_per_frame = SDL_GetTicks(); // For capping FPS
    long countedFrames = 0;

    while(true){

        SDL_Event event;

        while(SDL_PollEvent(&event)) {
            if (event.type == SDL_QUIT)
                exit(0);

            if (event.type == SDL_KEYDOWN){
                if (event.key.keysym.sym == SDLK_ESCAPE)
                    exit(0);

                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 1;
                    }
                }
            }

            if (event.type == SDL_KEYUP){
                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 0;
                    }
                }
            }
        }

        if (timer == CLOCK_DELAYER){
            emulator.emulateCycle();
            timer = 0;
        }

        else {
            timer += 1;
        }


        int pitch;
        void* m_pixels;


        if (emulator.drawFlag){

            if(SDL_LockTexture(texture, NULL, (void **)&m_pixels, &pitch) < 0){
                std::cerr << "Couldn't lock texture!\n" << SDL_GetError() << std::endl;
            }

            for (int i = 0; i < (GRAPHICS_HEIGHT * GRAPHICS_WIDTH); ++i){
                pixels[i] = ((0x00FFFFFF *  emulator.graphics[i]) | 0xFF000000);
            }

            memcpy(m_pixels, pixels, GRAPHICS_HEIGHT*pitch);
            SDL_UnlockTexture(texture);

            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer,texture,NULL,NULL);
            SDL_RenderPresent(renderer);


            emulator.drawFlag = false;

            if((1000 / FPS_CAP) > (SDL_GetTicks() - start_per_frame)){
                SDL_Delay( (1000 / FPS_CAP) - (SDL_GetTicks() - start_per_frame));
            }
            start_per_frame = SDL_GetTicks();
            float avgFPS = countedFrames / ( (SDL_GetTicks() - start) / 1000.f );
			if( avgFPS > 2000000 ){
				avgFPS = 0;
			}
            ++countedFrames;

            std::cerr << "Avg. FPS: " << avgFPS << "\r";
        }
        if (emulator.beepFlag){
            std::cerr << "Beep!!                    \r" << std::endl;
            //TODO

            emulator.beepFlag = false;
        }

    }

    return 0;
}